

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Functional::anon_unknown_0::PointCase::testRender(PointCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  Context *pCVar3;
  Surface *pSVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  RenderTarget *pRVar10;
  RenderTarget *pRVar11;
  MessageBuilder *pMVar12;
  LogImage *diffMask_00;
  ConstPixelBufferAccess *pCVar13;
  Vec4 *p;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  long lVar14;
  int __fd;
  ulong uVar15;
  allocator<char> local_6b10;
  allocator<char> local_6b0f;
  allocator<char> local_6b0e;
  allocator<char> local_6b0d;
  allocator<char> local_6b0c;
  allocator<char> local_6b0b;
  allocator<char> local_6b0a;
  allocator<char> local_6b09;
  TestLog *local_6b08;
  float *local_6b00;
  int *local_6af8;
  int *local_6af0;
  int *local_6ae8;
  WindowRectangle *local_6ae0;
  long local_6ad8;
  Surface diffMask;
  Surface refSurface;
  Surface testSurface;
  Surface *surfaces [2];
  Context *contexts [2];
  string local_6a68;
  string local_6a48;
  string local_6a28;
  string local_6a08;
  string local_69e8;
  string local_69c8;
  string local_69a8;
  string local_6988;
  LogImage local_6968;
  LogImageSet local_68d8;
  ConstPixelBufferAccess local_6898;
  ConstPixelBufferAccess local_6870;
  ConstPixelBufferAccess local_6848;
  ReferenceContextBuffers buffers;
  ReferenceContextLimits local_67a8;
  MessageBuilder local_6750;
  LogImage local_65d0;
  LogImage local_6540;
  PositionColorShader program;
  GLContext glesContext;
  ReferenceContext refContext;
  
  pRVar10 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  iVar9 = 1;
  if (1 < pRVar10->m_numSamples) {
    iVar9 = pRVar10->m_numSamples;
  }
  pTVar2 = ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  refContext.super_Context._vptr_Context = (_func_int **)0x0;
  refContext.super_Context.m_type.super_ApiType.m_bits = (ApiType)0xc8;
  refContext.super_Context._12_4_ = 200;
  sglr::GLContext::GLContext
            (&glesContext,((this->super_RenderTestCase).super_TestCase.m_context)->m_renderCtx,
             pTVar2,0,(IVec4 *)&refContext);
  local_67a8.extensionStr._M_dataplus._M_p = (pointer)&local_67a8.extensionStr.field_2;
  local_67a8.contextType.super_ApiType.m_bits = (ApiType)0x3;
  local_67a8.maxTextureImageUnits = 0x10;
  local_67a8.maxTexture2DSize = 0x800;
  local_67a8.maxTextureCubeSize = 0x800;
  local_67a8.maxTexture2DArrayLayers = 0x100;
  local_67a8.maxTexture3DSize = 0x100;
  local_67a8.maxRenderbufferSize = 0x800;
  local_67a8.maxVertexAttribs = 0x10;
  local_67a8.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_67a8.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_67a8.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_67a8.extensionStr._M_string_length = 0;
  local_67a8.extensionStr.field_2._M_local_buf[0] = '\0';
  pRVar10 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  pRVar11 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&buffers,&pRVar10->m_pixelFormat,pRVar11->m_depthBits,0,200,200,iVar9);
  sglr::ReferenceContextBuffers::getColorbuffer
            ((MultisamplePixelBufferAccess *)&local_6750,&buffers);
  sglr::ReferenceContextBuffers::getDepthbuffer((MultisamplePixelBufferAccess *)&program,&buffers);
  sglr::ReferenceContextBuffers::getStencilbuffer
            ((MultisamplePixelBufferAccess *)&local_6968,&buffers);
  sglr::ReferenceContext::ReferenceContext
            (&refContext,&local_67a8,(MultisamplePixelBufferAccess *)&local_6750,
             (MultisamplePixelBufferAccess *)&program,(MultisamplePixelBufferAccess *)&local_6968);
  PositionColorShader::PositionColorShader(&program);
  tcu::Surface::Surface(&testSurface,200,200);
  tcu::Surface::Surface(&refSurface,200,200);
  poVar1 = &local_6750.m_str;
  surfaces[0] = &testSurface;
  surfaces[1] = &refSurface;
  contexts[0] = &glesContext.super_Context;
  contexts[1] = &refContext.super_Context;
  local_6750.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Viewport: left=");
  local_6ae0 = &this->m_viewport;
  pMVar12 = tcu::MessageBuilder::operator<<(&local_6750,&local_6ae0->left);
  std::operator<<((ostream *)&pMVar12->m_str,"\tbottom=");
  local_6ae8 = &(this->m_viewport).bottom;
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,local_6ae8);
  std::operator<<((ostream *)&pMVar12->m_str,"\twidth=");
  local_6af0 = &(this->m_viewport).width;
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,local_6af0);
  std::operator<<((ostream *)&pMVar12->m_str,"\theight=");
  local_6af8 = &(this->m_viewport).height;
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,local_6af8);
  tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_6750.m_str;
  local_6750.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  local_6b08 = pTVar2;
  std::operator<<((ostream *)poVar1,"Rendering points with point size ");
  local_6b00 = &this->m_pointSize;
  pMVar12 = tcu::MessageBuilder::operator<<(&local_6750,local_6b00);
  std::operator<<((ostream *)&pMVar12->m_str,". Coordinates:");
  tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_6750.m_str;
  lVar14 = 0;
  for (uVar15 = 0;
      uVar15 < (ulong)((long)(this->m_points).
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_points).
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4); uVar15 = uVar15 + 1) {
    local_6750.m_log = local_6b08;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"\tx=");
    std::ostream::operator<<
              (poVar1,*(float *)((long)((this->m_points).
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14)
              );
    std::operator<<((ostream *)poVar1,"\ty=");
    std::ostream::operator<<
              (poVar1,*(float *)((long)((this->m_points).
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                lVar14 + 4));
    std::operator<<((ostream *)poVar1,"\tz=");
    std::ostream::operator<<
              (poVar1,*(float *)((long)((this->m_points).
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                lVar14 + 8));
    std::operator<<((ostream *)poVar1,"\tw=");
    std::ostream::operator<<
              (poVar1,*(float *)((long)((this->m_points).
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                lVar14 + 0xc));
    std::operator<<((ostream *)poVar1,"\t");
    (anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              (&local_6968.m_name,
               (_anonymous_namespace_ *)
               ((long)((this->m_points).
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14),p);
    std::operator<<((ostream *)poVar1,(string *)&local_6968);
    tcu::MessageBuilder::operator<<(&local_6750,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_6968);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    lVar14 = lVar14 + 0x10;
  }
  lVar14 = 0;
  while (lVar14 != 2) {
    pCVar3 = contexts[lVar14];
    pSVar4 = surfaces[lVar14];
    uVar5 = (*pCVar3->_vptr_Context[0x75])(pCVar3,&program);
    uVar6 = (*pCVar3->_vptr_Context[0x59])(pCVar3,(ulong)uVar5,"a_position");
    local_6ad8 = lVar14;
    uVar7 = (*pCVar3->_vptr_Context[0x59])(pCVar3,(ulong)uVar5,"a_pointSize");
    uVar8 = (*pCVar3->_vptr_Context[0x59])(pCVar3,(ulong)uVar5,"a_color");
    (*pCVar3->_vptr_Context[0x2a])(0,0,0,0x3f800000,pCVar3);
    (*pCVar3->_vptr_Context[0x2b])(0x3f800000,pCVar3);
    (*pCVar3->_vptr_Context[0x2d])(pCVar3,0x4100);
    (*pCVar3->_vptr_Context[5])
              (pCVar3,(ulong)(uint)local_6ae0->left,(ulong)(uint)*local_6ae8,
               (ulong)(uint)*local_6af0,(ulong)(uint)*local_6af8);
    (*pCVar3->_vptr_Context[0x76])(pCVar3,(ulong)uVar5);
    (*pCVar3->_vptr_Context[0x50])(pCVar3,(ulong)uVar6);
    (*pCVar3->_vptr_Context[0x4e])
              (pCVar3,(ulong)uVar6,4,0x1406,0,0,
               (this->m_points).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    (*pCVar3->_vptr_Context[0x53])(*local_6b00,pCVar3,(ulong)uVar7);
    (*pCVar3->_vptr_Context[0x56])(pCVar3,(ulong)uVar8);
    (*pCVar3->_vptr_Context[0x68])
              (pCVar3,0,0,
               (ulong)((long)(this->m_points).
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_points).
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4);
    (*pCVar3->_vptr_Context[0x51])(pCVar3,(ulong)uVar6);
    (*pCVar3->_vptr_Context[0x76])(pCVar3,0);
    (*pCVar3->_vptr_Context[0x77])(pCVar3,(ulong)uVar5);
    (*pCVar3->_vptr_Context[0x7a])(pCVar3);
    (*pCVar3->_vptr_Context[0x80])(pCVar3,pSVar4,0,0,200);
    lVar14 = local_6ad8 + 1;
  }
  tcu::Surface::Surface(&diffMask,200,200);
  pTVar2 = local_6b08;
  poVar1 = &local_6750.m_str;
  local_6750.m_log = local_6b08;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Comparing images... ");
  tcu::MessageBuilder::operator<<(&local_6750,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_6750.m_str;
  local_6750.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Deviation within radius of ");
  std::ostream::operator<<(poVar1,1);
  std::operator<<((ostream *)poVar1," is allowed.");
  tcu::MessageBuilder::operator<<(&local_6750,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_6750,&testSurface);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_6968,&refSurface);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_65d0,&diffMask);
  diffMask_00 = &local_65d0;
  iVar9 = compareBlackNonBlackImages
                    (pTVar2,(ConstPixelBufferAccess *)&local_6750,
                     (ConstPixelBufferAccess *)&local_6968,(PixelBufferAccess *)diffMask_00,1);
  if (0 < iVar9) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6988,"Images",&local_6b09);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_69a8,"Image comparison",&local_6b0a);
    tcu::LogImageSet::LogImageSet(&local_68d8,&local_6988,&local_69a8);
    __fd = (int)pTVar2;
    tcu::LogImageSet::write(&local_68d8,__fd,__buf,(size_t)diffMask_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_69c8,"TestImage",&local_6b0b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_69e8,"Test image",&local_6b0c);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_6848,&testSurface);
    pCVar13 = &local_6848;
    tcu::LogImage::LogImage
              (&local_6968,&local_69c8,&local_69e8,pCVar13,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_6968,__fd,__buf_00,(size_t)pCVar13);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a08,"ReferenceImage",&local_6b0d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a28,"Reference image",&local_6b0e);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_6870,&refSurface);
    pCVar13 = &local_6870;
    tcu::LogImage::LogImage
              (&local_65d0,&local_6a08,&local_6a28,pCVar13,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_65d0,__fd,__buf_01,(size_t)pCVar13);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a48,"DifferenceMask",&local_6b0f);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a68,"Difference mask",&local_6b10);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_6898,&diffMask);
    pCVar13 = &local_6898;
    tcu::LogImage::LogImage
              (&local_6540,&local_6a48,&local_6a68,pCVar13,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_6540,__fd,__buf_02,(size_t)pCVar13);
    tcu::TestLog::endImageSet(pTVar2);
    poVar1 = &local_6750.m_str;
    local_6750.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Got ");
    std::ostream::operator<<(poVar1,iVar9);
    std::operator<<((ostream *)poVar1," faulty pixel(s).");
    tcu::MessageBuilder::operator<<(&local_6750,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    tcu::LogImage::~LogImage(&local_6540);
    std::__cxx11::string::~string((string *)&local_6a68);
    std::__cxx11::string::~string((string *)&local_6a48);
    tcu::LogImage::~LogImage(&local_65d0);
    std::__cxx11::string::~string((string *)&local_6a28);
    std::__cxx11::string::~string((string *)&local_6a08);
    tcu::LogImage::~LogImage(&local_6968);
    std::__cxx11::string::~string((string *)&local_69e8);
    std::__cxx11::string::~string((string *)&local_69c8);
    tcu::LogImageSet::~LogImageSet(&local_68d8);
    std::__cxx11::string::~string((string *)&local_69a8);
    std::__cxx11::string::~string((string *)&local_6988);
    tcu::TestContext::setTestResult
              ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Got faulty pixels");
  }
  tcu::Surface::~Surface(&diffMask);
  tcu::Surface::~Surface(&refSurface);
  tcu::Surface::~Surface(&testSurface);
  sglr::ShaderProgram::~ShaderProgram(&program.super_ShaderProgram);
  sglr::ReferenceContext::~ReferenceContext(&refContext);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers(&buffers);
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_67a8);
  sglr::GLContext::~GLContext(&glesContext);
  return;
}

Assistant:

void PointCase::testRender (void)
{
	using tcu::TestLog;

	const int numSamples			= de::max(m_context.getRenderTarget().getNumSamples(), 1);

	tcu::TestLog&					log			= m_testCtx.getLog();
	sglr::GLContext					glesContext	(m_context.getRenderContext(), log, 0, tcu::IVec4(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE));
	sglr::ReferenceContextLimits	limits;
	sglr::ReferenceContextBuffers	buffers		(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, numSamples);
	sglr::ReferenceContext			refContext	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());
	PositionColorShader				program;
	tcu::Surface					testSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface					refSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	sglr::Context*					contexts[2] = {&glesContext, &refContext};
	tcu::Surface*					surfaces[2] = {&testSurface, &refSurface};

	// log the purpose of the test
	log << TestLog::Message << "Viewport: left=" << m_viewport.left << "\tbottom=" << m_viewport.bottom << "\twidth=" << m_viewport.width << "\theight=" << m_viewport.height << TestLog::EndMessage;
	log << TestLog::Message << "Rendering points with point size " << m_pointSize << ". Coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < m_points.size(); ++ndx)
		log << TestLog::Message
				<< "\tx=" << m_points[ndx].x()
				<< "\ty=" << m_points[ndx].y()
				<< "\tz=" << m_points[ndx].z()
				<< "\tw=" << m_points[ndx].w()
				<< "\t" << genClippingPointInfoString(m_points[ndx])
				<< TestLog::EndMessage;

	for (int contextNdx = 0; contextNdx < 2; ++contextNdx)
	{
		sglr::Context&	ctx				= *contexts[contextNdx];
		tcu::Surface&	dstSurface		= *surfaces[contextNdx];
		const deUint32	programId		= ctx.createProgram(&program);
		const GLint		positionLoc		= ctx.getAttribLocation(programId, "a_position");
		const GLint		pointSizeLoc	= ctx.getAttribLocation(programId, "a_pointSize");
		const GLint		colorLoc		= ctx.getAttribLocation(programId, "a_color");

		ctx.clearColor					(0, 0, 0, 1);
		ctx.clearDepthf					(1.0f);
		ctx.clear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		ctx.viewport					(m_viewport.left, m_viewport.bottom, m_viewport.width, m_viewport.height);
		ctx.useProgram					(programId);
		ctx.enableVertexAttribArray		(positionLoc);
		ctx.vertexAttribPointer			(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &m_points[0]);
		ctx.vertexAttrib1f				(pointSizeLoc, m_pointSize);
		ctx.vertexAttrib4f				(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
		ctx.drawArrays					(GL_POINTS, 0, (glw::GLsizei)m_points.size());
		ctx.disableVertexAttribArray	(positionLoc);
		ctx.useProgram					(0);
		ctx.deleteProgram				(programId);
		ctx.finish						();

		ctx.readPixels(dstSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	}

	// do the comparison
	{
		tcu::Surface		diffMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		const int			kernelRadius	= 1;
		int					faultyPixels;

		log << TestLog::Message << "Comparing images... " << TestLog::EndMessage;
		log << TestLog::Message << "Deviation within radius of " << kernelRadius << " is allowed." << TestLog::EndMessage;

		faultyPixels = compareBlackNonBlackImages(log, testSurface.getAccess(), refSurface.getAccess(), diffMask.getAccess(), kernelRadius);

		if (faultyPixels > 0)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testSurface.getAccess())
				<< TestLog::Image("ReferenceImage", "Reference image", refSurface.getAccess())
				<< TestLog::Image("DifferenceMask", "Difference mask", diffMask.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
		}
	}
}